

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

piga_client * piga_client_create(void)

{
  piga_client *ppVar1;
  piga_client *client;
  
  ppVar1 = (piga_client *)malloc(0x40);
  ppVar1->config = (piga_client_config *)0x0;
  ppVar1->shared_memory_id = 0;
  (ppVar1->shared_memory).start = (void *)0x0;
  (ppVar1->shared_memory).players = (piga_player **)0x0;
  ppVar1->in_queue = (piga_event_queue *)0x0;
  ppVar1->in_queue_shm_id = 0;
  ppVar1->out_queue = (piga_event_queue *)0x0;
  ppVar1->out_queue_shm_id = 0;
  return ppVar1;
}

Assistant:

piga_client* piga_client_create()
{
    piga_client *client = (piga_client*) malloc(sizeof(piga_client));
    client->config = NULL;
    client->shared_memory_id = 0;
    client->shared_memory.start = NULL;
    client->shared_memory.players = NULL;
    client->in_queue = 0;
    client->in_queue_shm_id = 0;
    client->out_queue = 0;
    client->out_queue_shm_id = 0;
    return client;
}